

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncEvent.cpp
# Opt level: O2

void __thiscall cali::TimedAsyncEvent::end(TimedAsyncEvent *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  Attribute AVar4;
  undefined4 extraout_var;
  SnapshotView info;
  allocator<char> local_79;
  Caliper c;
  Entry local_58;
  Node *local_40;
  undefined8 local_38;
  long local_30;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  lVar1 = (this->start_time_).__d.__r;
  Caliper::Caliper(&c);
  if (_ZZN12_GLOBAL__N_123get_event_duration_attrERN4cali7CaliperEE11s_attr_node_0 == (Node *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"event.duration.ns",&local_79);
    iVar2 = (*c.super_CaliperMetadataAccessInterface._vptr_CaliperMetadataAccessInterface[4])
                      (&c,&local_58,3,0x841,0,0,0);
    AVar4.m_node = (Node *)CONCAT44(extraout_var,iVar2);
    std::__cxx11::string::~string((string *)&local_58);
    LOCK();
    UNLOCK();
    _ZZN12_GLOBAL__N_123get_event_duration_attrERN4cali7CaliperEE11s_attr_node_0 = AVar4.m_node;
  }
  else {
    AVar4 = Attribute::make_attribute
                      (_ZZN12_GLOBAL__N_123get_event_duration_attrERN4cali7CaliperEE11s_attr_node_0)
    ;
  }
  local_30 = lVar3 - lVar1;
  local_58.m_node = this->end_tree_node_;
  local_58.m_value.m_v.type_and_size = ((local_58.m_node)->m_data).m_v.type_and_size;
  local_58.m_value.m_v.value = ((local_58.m_node)->m_data).m_v.value;
  local_38 = 3;
  info.m_len = 2;
  info.m_data = &local_58;
  local_40 = AVar4.m_node;
  Caliper::async_event(&c,info);
  return;
}

Assistant:

void TimedAsyncEvent::end()
{
    uint64_t nsec = std::chrono::duration_cast<std::chrono::nanoseconds>(clock::now() - start_time_).count();

    Caliper c;
    Attribute duration_attr = ::get_event_duration_attr(c);
    const Entry data[2] = {
        { end_tree_node_ }, { duration_attr, cali_make_variant_from_uint(nsec) }
    };

    c.async_event(SnapshotView(2, data));
}